

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser_.cxx
# Opt level: O2

void __thiscall Fl_Browser_::draw(Fl_Browser_ *this)

{
  uchar *puVar1;
  Fl_Scrollbar *pFVar2;
  bool bVar3;
  int X_00;
  byte bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Fl_Color c;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *pvVar9;
  int iVar10;
  uint Y_00;
  ulong uVar11;
  ulong uVar12;
  undefined8 unaff_R15;
  undefined8 uVar13;
  int H;
  int W;
  int Y;
  int X;
  int local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  uint local_50;
  int local_4c;
  void **local_48;
  Fl_Browser_ *local_40;
  ulong local_38;
  undefined4 extraout_var_01;
  
  update_top(this);
  iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x15])(this);
  iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
  bbox(this,&X,&Y,&W,&H);
  local_48 = &this->redraw1;
  bVar3 = false;
  uVar13 = CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
  local_40 = this;
  while( true ) {
    if ((char)(this->super_Fl_Group).super_Fl_Widget.damage_ < '\0') {
      bVar4 = (this->super_Fl_Group).super_Fl_Widget.box_;
      if (bVar4 == 0) {
        bVar4 = 3;
      }
      Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar4,(this->super_Fl_Group).super_Fl_Widget.x_,
                          (this->super_Fl_Group).super_Fl_Widget.y_,
                          (this->super_Fl_Group).super_Fl_Widget.w_,
                          (this->super_Fl_Group).super_Fl_Widget.h_,
                          (this->super_Fl_Group).super_Fl_Widget.color_);
      bVar3 = true;
    }
    if (((this->has_scrollbar_ & 2) == 0) ||
       ((((this->has_scrollbar_ & 4) == 0 && (this->position_ == 0)) && (iVar6 <= H)))) {
      iVar7 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      this->top_ = (void *)CONCAT44(extraout_var,iVar7);
      this->offset_ = 0;
      this->real_position_ = 0;
      uVar8 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar8 & 2) == 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar8 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar8 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar8 & 2) != 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar8 & 0xfffffffd;
        bbox(this,&X,&Y,&W,&H);
        bVar3 = true;
      }
    }
    bVar4 = this->has_scrollbar_;
    if (((bVar4 & 1) == 0) || ((((bVar4 & 4) == 0 && (this->hposition_ == 0)) && (iVar5 <= W)))) {
      this->real_hposition_ = 0;
      uVar8 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar8 & 2) == 0) {
        (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar8 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar8 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar8 & 2) != 0) {
        (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar8 & 0xfffffffd;
        bbox(this,&X,&Y,&W,&H);
        bVar4 = this->has_scrollbar_;
        bVar3 = true;
      }
    }
    local_50 = (uint)uVar13;
    local_68 = iVar6;
    local_64 = iVar5;
    if (((bVar4 & 2) == 0) || ((((bVar4 & 4) == 0 && (this->position_ == 0)) && (iVar6 <= H)))) {
      iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[10])(this);
      this->top_ = (void *)CONCAT44(extraout_var_00,iVar6);
      this->offset_ = 0;
      this->real_position_ = 0;
      uVar8 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar8 & 2) == 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ = uVar8 | 2;
        puVar1 = &(this->super_Fl_Group).super_Fl_Widget.damage_;
        *puVar1 = *puVar1 | 4;
      }
    }
    else {
      uVar8 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
      if ((uVar8 & 2) != 0) {
        (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ =
             uVar8 & 0xfffffffd;
        bbox(this,&X,&Y,&W,&H);
        bVar3 = true;
      }
    }
    bbox(this,&X,&Y,&W,&H);
    X_00 = X;
    iVar6 = W;
    iVar7 = H;
    local_60 = (ulong)(uint)Y;
    uVar12 = (ulong)(uint)W;
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])();
    pvVar9 = this->top_;
    uVar11 = (ulong)(uint)-this->offset_;
    local_4c = iVar6 + 1;
    local_6c = iVar7;
    local_58 = uVar12;
    while ((iVar6 = (int)uVar11, pvVar9 != (void *)0x0 && (iVar6 < iVar7))) {
      uVar8 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xe])(this,pvVar9);
      if (0 < (int)uVar8) {
        if (((((this->super_Fl_Group).super_Fl_Widget.damage_ & 0x84) != 0) ||
            (pvVar9 == this->redraw1)) || (pvVar9 == this->redraw2)) {
          iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x19])(this,pvVar9);
          if (iVar5 == 0) {
            Y_00 = iVar6 + (int)local_60;
            if (-1 < (char)(this->super_Fl_Group).super_Fl_Widget.damage_) {
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                        (fl_graphics_driver,(ulong)(uint)X_00,(ulong)Y_00,uVar12 & 0xffffffff,
                         (ulong)uVar8);
              bVar4 = (this->super_Fl_Group).super_Fl_Widget.box_;
              if (bVar4 == 0) {
                bVar4 = 3;
              }
              Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar4,
                                  (this->super_Fl_Group).super_Fl_Widget.x_,
                                  (this->super_Fl_Group).super_Fl_Widget.y_,
                                  (this->super_Fl_Group).super_Fl_Widget.w_,
                                  (this->super_Fl_Group).super_Fl_Widget.h_,
                                  (this->super_Fl_Group).super_Fl_Widget.color_);
              (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
            }
          }
          else {
            iVar5 = Fl_Widget::active_r((Fl_Widget *)this);
            c = (this->super_Fl_Group).super_Fl_Widget.color2_;
            if (iVar5 == 0) {
              c = fl_inactive(c);
            }
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                      (fl_graphics_driver,(ulong)c);
            uVar12 = local_58;
            Y_00 = iVar6 + (int)local_60;
            (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
                      (fl_graphics_driver,(ulong)(uint)X_00,(ulong)Y_00,local_58 & 0xffffffff,
                       (ulong)uVar8);
            this = local_40;
          }
          (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x11])
                    (this,pvVar9,(ulong)(uint)(X_00 - this->hposition_),(ulong)Y_00,
                     (ulong)(uint)(this->hposition_ + (int)uVar12),(ulong)uVar8);
          if ((pvVar9 == this->selection_) && ((Fl_Browser_ *)Fl::focus_ == this)) {
            local_38 = uVar11;
            Fl_Widget::draw_box((Fl_Widget *)this,FL_BORDER_FRAME,X_00,Y_00,(int)uVar12,uVar8,
                                (this->super_Fl_Group).super_Fl_Widget.color_);
            uVar11 = local_38;
            Fl_Widget::draw_focus((Fl_Widget *)this,FL_NO_BOX,X_00,Y_00,local_4c,uVar8 + 1);
          }
          iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xf])(this,pvVar9);
          iVar7 = local_6c;
          if (this->max_width < iVar6) {
            this->max_width = iVar6;
            this->max_width_item = pvVar9;
          }
        }
        uVar11 = (ulong)((int)uVar11 + uVar8);
      }
      iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0xb])(this,pvVar9);
      pvVar9 = (void *)CONCAT44(extraout_var_01,iVar6);
    }
    if ((-1 < (char)(this->super_Fl_Group).super_Fl_Widget.damage_) && (iVar6 < iVar7)) {
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
                (fl_graphics_driver,(ulong)(uint)X_00,(ulong)(uint)(iVar6 + (int)local_60),
                 uVar12 & 0xffffffff);
      bVar4 = (this->super_Fl_Group).super_Fl_Widget.box_;
      if (bVar4 == 0) {
        bVar4 = 3;
      }
      Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar4,(this->super_Fl_Group).super_Fl_Widget.x_,
                          (this->super_Fl_Group).super_Fl_Widget.y_,
                          (this->super_Fl_Group).super_Fl_Widget.w_,
                          (this->super_Fl_Group).super_Fl_Widget.h_,
                          (this->super_Fl_Group).super_Fl_Widget.color_);
      iVar7 = local_6c;
      (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    }
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2a])
              (fl_graphics_driver,(ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.x_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.y_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.w_,
               (ulong)(uint)(this->super_Fl_Group).super_Fl_Widget.h_);
    *local_48 = (void *)0x0;
    local_48[1] = (void *)0x0;
    iVar6 = local_68;
    iVar5 = local_64;
    if ((local_50 & 1) == 0) break;
    iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x16])(this);
    iVar5 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x15])(this);
    bVar4 = this->has_scrollbar_;
    if (((bVar4 & 2) == 0) || (((iVar6 <= iVar7 && ((bVar4 & 4) == 0)) && (this->position_ == 0))))
    {
      if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
      goto LAB_001a745a;
    }
    else if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)
    {
LAB_001a745a:
      if (((bVar4 & 1) == 0) ||
         (((iVar5 <= (int)local_58 && ((bVar4 & 4) == 0)) && (this->hposition_ == 0)))) {
        if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) != 0)
        break;
      }
      else if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) ==
               0) break;
    }
    Fl_Widget::damage((Fl_Widget *)this,0x80);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
    uVar13 = 0;
  }
  local_64 = iVar5;
  local_68 = iVar6;
  uVar8 = this->scrollbar_size_;
  if (uVar8 == 0) {
    uVar8 = Fl::scrollbar_size();
  }
  uVar12 = local_58;
  if (this->top_ == (void *)0x0) {
    iVar6 = 0;
  }
  else {
    iVar6 = (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[0x10])(this);
  }
  iVar5 = 10;
  if (10 < iVar6) {
    iVar5 = iVar6;
  }
  iVar6 = (int)uVar12;
  if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
    pFVar2 = &this->scrollbar;
    iVar10 = -uVar8;
    if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 4) == 0
       ) {
      iVar10 = iVar6;
    }
    Fl_Widget::damage_resize((Fl_Widget *)pFVar2,iVar10 + X_00,(int)local_60,uVar8,iVar7);
    Fl_Slider::scrollvalue(&pFVar2->super_Fl_Slider,this->position_,iVar7,0,local_68);
    *(int *)&(this->scrollbar).super_Fl_Slider.field_0xac = iVar5;
    if (bVar3) {
      Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)pFVar2);
      iVar7 = local_6c;
    }
    else {
      Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)pFVar2);
      iVar7 = local_6c;
    }
  }
  if (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) {
    pFVar2 = &this->hscrollbar;
    iVar10 = -uVar8;
    if (((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_ & 1) == 0
       ) {
      iVar10 = iVar7;
    }
    Fl_Widget::damage_resize((Fl_Widget *)pFVar2,X_00,iVar10 + (int)local_60,iVar6,uVar8);
    Fl_Slider::scrollvalue(&pFVar2->super_Fl_Slider,this->hposition_,iVar6,0,local_64);
    *(int *)&(this->hscrollbar).super_Fl_Slider.field_0xac = iVar5;
    if (!bVar3) {
      Fl_Group::update_child(&this->super_Fl_Group,(Fl_Widget *)pFVar2);
      goto LAB_001a7633;
    }
    Fl_Group::draw_child(&this->super_Fl_Group,(Fl_Widget *)pFVar2);
  }
  else if (!bVar3) goto LAB_001a7633;
  if ((((this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0) &&
     (((this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ & 2) == 0)) {
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
              (fl_graphics_driver,
               (ulong)(((this->super_Fl_Group).super_Fl_Widget.parent_)->super_Fl_Widget).color_);
    (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[4])
              (fl_graphics_driver,
               (ulong)(uint)(this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.x_,
               (ulong)(uint)(this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.y_,
               (ulong)uVar8,(ulong)uVar8);
  }
LAB_001a7633:
  this->real_hposition_ = this->hposition_;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x2e])();
  return;
}

Assistant:

void Fl_Browser_::draw() {
  int drawsquare = 0;
  update_top();
  int full_width_ = full_width();
  int full_height_ = full_height();
  int X, Y, W, H; bbox(X, Y, W, H);
  int dont_repeat = 0;
J1:
  if (damage() & FL_DAMAGE_ALL) { // redraw the box if full redraw
    Fl_Boxtype b = box() ? box() : FL_DOWN_BOX;
    draw_box(b, x(), y(), w(), h(), color());
    drawsquare = 1;
  }
  // see if scrollbar needs to be switched on/off:
  if ((has_scrollbar_ & VERTICAL) && (
	(has_scrollbar_ & ALWAYS_ON) || position_ || full_height_ > H)) {
    if (!scrollbar.visible()) {
      scrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    top_ = item_first(); real_position_ = offset_ = 0;
    if (scrollbar.visible()) {
      scrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  if ((has_scrollbar_ & HORIZONTAL) && (
	(has_scrollbar_ & ALWAYS_ON) || hposition_ || full_width_ > W)) {
    if (!hscrollbar.visible()) {
      hscrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    real_hposition_ = 0;
    if (hscrollbar.visible()) {
      hscrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  // Check the vertical scrollbar again, just in case it needs to be drawn
  // because the horizontal one is drawn.  There should be a cleaner way
  // to do this besides copying the same code...
  if ((has_scrollbar_ & VERTICAL) && (
	(has_scrollbar_ & ALWAYS_ON) || position_ || full_height_ > H)) {
    if (!scrollbar.visible()) {
      scrollbar.set_visible();
      drawsquare = 1;
      bbox(X, Y, W, H);
    }
  } else {
    top_ = item_first(); real_position_ = offset_ = 0;
    if (scrollbar.visible()) {
      scrollbar.clear_visible();
      clear_damage((uchar)(damage()|FL_DAMAGE_SCROLL));
    }
  }

  bbox(X, Y, W, H);

  fl_push_clip(X, Y, W, H);
  // for each line, draw it if full redraw or scrolled.  Erase background
  // if not a full redraw or if it is selected:
  void* l = top();
  int yy = -offset_;
  for (; l && yy < H; l = item_next(l)) {
    int hh = item_height(l);
    if (hh <= 0) continue;
    if ((damage()&(FL_DAMAGE_SCROLL|FL_DAMAGE_ALL)) || l == redraw1 || l == redraw2) {
      if (item_selected(l)) {
	fl_color(active_r() ? selection_color() : fl_inactive(selection_color()));
	fl_rectf(X, yy+Y, W, hh);
      } else if (!(damage()&FL_DAMAGE_ALL)) {
	fl_push_clip(X, yy+Y, W, hh);
	draw_box(box() ? box() : FL_DOWN_BOX, x(), y(), w(), h(), color());
	fl_pop_clip();
      }
      item_draw(l, X-hposition_, yy+Y, W+hposition_, hh);
      if (l == selection_ && Fl::focus() == this) {
	draw_box(FL_BORDER_FRAME, X, yy+Y, W, hh, color());
	draw_focus(FL_NO_BOX, X, yy+Y, W+1, hh+1);
      }
      int ww = item_width(l);
      if (ww > max_width) {max_width = ww; max_width_item = l;}
    }
    yy += hh;
  }
  // erase the area below last line:
  if (!(damage()&FL_DAMAGE_ALL) && yy < H) {
    fl_push_clip(X, yy+Y, W, H-yy);
    draw_box(box() ? box() : FL_DOWN_BOX, x(), y(), w(), h(), color());
    fl_pop_clip();
  }
  fl_pop_clip();

  fl_push_clip(x(),y(),w(),h());		// STR# 2886
  redraw1 = redraw2 = 0;
  if (!dont_repeat) {
    dont_repeat = 1;
    // see if changes to full_height caused by calls to slow_height
    // caused scrollbar state to change, in which case we have to redraw:
    full_height_ = full_height();
    full_width_ = full_width();
    if ((has_scrollbar_ & VERTICAL) &&
	((has_scrollbar_ & ALWAYS_ON) || position_ || full_height_>H)) {
      if (!scrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    } else {
      if (scrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    }
    if ((has_scrollbar_ & HORIZONTAL) &&
	((has_scrollbar_ & ALWAYS_ON) || hposition_ || full_width_>W)) {
      if (!hscrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    } else {
      if (hscrollbar.visible()) { damage(FL_DAMAGE_ALL); fl_pop_clip(); goto J1; }
    }
  }

  // update the scrollbars and redraw them:
  int scrollsize = scrollbar_size_ ? scrollbar_size_ : Fl::scrollbar_size();
  int dy = top_ ? item_quick_height(top_) : 0; if (dy < 10) dy = 10;
  if (scrollbar.visible()) {
    scrollbar.damage_resize(
	scrollbar.align()&FL_ALIGN_LEFT ? X-scrollsize : X+W,
	Y, scrollsize, H);
    scrollbar.value(position_, H, 0, full_height_);
    scrollbar.linesize(dy);
    if (drawsquare) draw_child(scrollbar);
    else update_child(scrollbar);
  }
  if (hscrollbar.visible()) {
    hscrollbar.damage_resize(
	X, scrollbar.align()&FL_ALIGN_TOP ? Y-scrollsize : Y+H,
	W, scrollsize);
    hscrollbar.value(hposition_, W, 0, full_width_);
    hscrollbar.linesize(dy);
    if (drawsquare) draw_child(hscrollbar);
    else update_child(hscrollbar);
  }

  // draw that little square between the scrollbars:
  if (drawsquare && scrollbar.visible() && hscrollbar.visible()) {
    fl_color(parent()->color());
    fl_rectf(scrollbar.x(), hscrollbar.y(), scrollsize, scrollsize);
  }

  real_hposition_ = hposition_;
  fl_pop_clip();
}